

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cpp
# Opt level: O0

string * __thiscall
higan::System::RunShellCommand
          (string *__return_storage_ptr__,System *this,string *command,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args)

{
  const_iterator pbVar1;
  string *psVar2;
  char *pcVar3;
  FILE *__stream;
  char local_488 [8];
  char buff [1024];
  FILE *ret_stream;
  string *arg;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  string run_command;
  string *command_local;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args_local;
  string *result;
  
  args_local._M_array = args._M_array;
  run_command.field_2._8_8_ = this;
  command_local = command;
  args_local._M_len = (size_type)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&__range1,(string *)this);
  __end1 = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&command_local);
  pbVar1 = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&command_local);
  for (; __end1 != pbVar1; __end1 = __end1 + 1) {
    psVar2 = (string *)std::__cxx11::string::append((char *)&__range1);
    std::__cxx11::string::append(psVar2);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  __stream = popen(pcVar3,"r");
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while (pcVar3 = fgets(local_488,0x400,__stream), pcVar3 != (char *)0x0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string System::RunShellCommand(std::string command, std::initializer_list<std::string> args)
{
	std::string run_command = std::move(command);

	for (const std::string& arg : args)
	{
		run_command.append(" ").append(arg); // difference between operator+ and append
	}

	FILE* ret_stream = popen(run_command.c_str(), "r");

	char buff[1024];
	std::string result;
	while (fgets(buff, sizeof buff, ret_stream) != nullptr)
	{
		result.append(buff);
	}

	return result;
}